

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O1

bool __thiscall ConnectFourState::has_moves(ConnectFourState *this)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (1 < this->player_to_move - 1U) {
    MCTS::assertion_failed
              ("player_to_move == 1 || player_to_move == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/connect_four.h"
               ,0xc4);
  }
  cVar3 = get_winner(this);
  if (cVar3 == '.') {
    uVar4 = (ulong)this->num_cols;
    bVar6 = 0 < (long)uVar4;
    if ((0 < (long)uVar4) &&
       (pcVar1 = (((this->board).
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
                 _M_start, *pcVar1 != '.')) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (uVar4 == uVar5) break;
        uVar2 = uVar5 + 1;
      } while (pcVar1[uVar5] != '.');
      bVar6 = uVar5 < uVar4;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

void check_invariant() const
	{
		attest(player_to_move == 1 || player_to_move == 2);
	}